

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::NeedDyndepForSource
          (cmGeneratorTarget *this,string *lang,string *config,cmSourceFile *sf)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  bool bVar3;
  Cxx20SupportLevel CVar4;
  int iVar5;
  PolicyStatus PVar6;
  cmFileSet *pcVar7;
  cmValue *this_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  allocator<char> local_61;
  cmValue tgtProp;
  string local_58;
  cmValue sfProp;
  
  __y._M_str = "Fortran";
  __y._M_len = 7;
  __x._M_str = (lang->_M_dataplus)._M_p;
  __x._M_len = lang->_M_string_length;
  bVar2 = std::operator==(__x,__y);
  bVar3 = true;
  if (!bVar2) {
    __y_00._M_str = "CXX";
    __y_00._M_len = 3;
    __x_00._M_str = (lang->_M_dataplus)._M_p;
    __x_00._M_len = lang->_M_string_length;
    bVar2 = std::operator!=(__x_00,__y_00);
    if (bVar2) {
      bVar3 = false;
    }
    else {
      pcVar7 = GetFileSetForSource(this,config,sf);
      if ((pcVar7 == (cmFileSet *)0x0) ||
         (__y_01._M_str = "CXX_MODULES", __y_01._M_len = 0xb,
         __x_01._M_str = (pcVar7->Type)._M_dataplus._M_p,
         __x_01._M_len = (pcVar7->Type)._M_string_length, bVar2 = std::operator==(__x_01,__y_01),
         !bVar2)) {
        CVar4 = HaveCxxModuleSupport(this,config);
        bVar3 = false;
        if (NoCxx20 < CVar4) {
          pcVar1 = this->LocalGenerator->GlobalGenerator;
          iVar5 = (*pcVar1->_vptr_cmGlobalGenerator[0xe])(pcVar1,1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"CXX_SCAN_FOR_MODULES",(allocator<char> *)&tgtProp);
          sfProp = cmSourceFile::GetProperty(sf,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          bVar2 = cmValue::IsSet(&sfProp);
          if (bVar2) {
            this_00 = &sfProp;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"CXX_SCAN_FOR_MODULES",&local_61);
            tgtProp = GetProperty(this,&local_58);
            std::__cxx11::string::~string((string *)&local_58);
            bVar2 = cmValue::IsSet(&tgtProp);
            if (!bVar2) {
              PVar6 = GetPolicyStatusCMP0155(this);
              return (bool)(CVar4 != MissingRule & (byte)iVar5 & PVar6 - NEW < 3);
            }
            this_00 = &tgtProp;
          }
          bVar3 = cmValue::IsOn(this_00);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmGeneratorTarget::NeedDyndepForSource(std::string const& lang,
                                            std::string const& config,
                                            cmSourceFile const* sf) const
{
  // Fortran always needs to be scanned.
  if (lang == "Fortran"_s) {
    return true;
  }
  // Only C++ code needs scanned otherwise.
  if (lang != "CXX"_s) {
    return false;
  }

  // Any file in `CXX_MODULES` file sets need scanned (it being `CXX` is
  // enforced elsewhere).
  auto const* fs = this->GetFileSetForSource(config, sf);
  if (fs && fs->GetType() == "CXX_MODULES"_s) {
    return true;
  }

  bool haveRule = false;
  switch (this->HaveCxxModuleSupport(config)) {
    case Cxx20SupportLevel::MissingCxx:
    case Cxx20SupportLevel::NoCxx20:
      return false;
    case Cxx20SupportLevel::MissingRule:
      break;
    case Cxx20SupportLevel::Supported:
      haveRule = true;
      break;
  }
  bool haveGeneratorSupport =
    this->GetGlobalGenerator()->CheckCxxModuleSupport(
      cmGlobalGenerator::CxxModuleSupportQuery::Inspect);
  auto const sfProp = sf->GetProperty("CXX_SCAN_FOR_MODULES");
  if (sfProp.IsSet()) {
    return sfProp.IsOn();
  }
  auto const tgtProp = this->GetProperty("CXX_SCAN_FOR_MODULES");
  if (tgtProp.IsSet()) {
    return tgtProp.IsOn();
  }

  bool policyAnswer = false;
  switch (this->GetPolicyStatusCMP0155()) {
    case cmPolicies::WARN:
    case cmPolicies::OLD:
      // The OLD behavior is to not scan the source.
      policyAnswer = false;
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      // The NEW behavior is to scan the source if the compiler supports
      // scanning and the generator supports it.
      policyAnswer = haveRule && haveGeneratorSupport;
      break;
  }
  return policyAnswer;
}